

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O3

void __thiscall
btAlignedObjectArray<btFace>::~btAlignedObjectArray(btAlignedObjectArray<btFace> *this)

{
  int iVar1;
  long lVar2;
  
  iVar1 = this->m_size;
  if (0 < (long)iVar1) {
    lVar2 = 0;
    do {
      btAlignedObjectArray<int>::~btAlignedObjectArray
                ((btAlignedObjectArray<int> *)((long)this->m_data->m_plane + lVar2 + -0x20));
      lVar2 = lVar2 + 0x30;
    } while ((long)iVar1 * 0x30 != lVar2);
  }
  if ((this->m_data != (btFace *)0x0) && (this->m_ownsMemory == true)) {
    btAlignedFreeInternal(this->m_data);
  }
  this->m_ownsMemory = true;
  this->m_data = (btFace *)0x0;
  this->m_size = 0;
  this->m_capacity = 0;
  return;
}

Assistant:

~btAlignedObjectArray()
		{
			clear();
		}